

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::info<>(context *ctx,char *fmt)

{
  bool bVar1;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,6);
  if (bVar1) {
    log<>(_stdout,6,fmt);
  }
  return;
}

Assistant:

void
info(const context& ctx, const char* fmt, const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
    if (!is_loggable(ctx.log_priority, 6))
        return;

    log(stdout, 6, fmt, args...);
#else
    detail::sink(ctx, fmt, args...);
#endif
}